

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool __thiscall mkvparser::Chapters::ExpandEditionsArray(Chapters *this)

{
  Edition *pEVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  Edition *this_00;
  long in_RDI;
  ulong uVar6;
  int idx;
  Edition *editions;
  int size;
  Edition *local_a0;
  Edition *local_78;
  int local_6c;
  int local_60;
  bool local_1;
  
  if (*(int *)(in_RDI + 0x34) < *(int *)(in_RDI + 0x30)) {
    local_1 = true;
  }
  else {
    if (*(int *)(in_RDI + 0x30) == 0) {
      local_6c = 1;
    }
    else {
      local_6c = *(int *)(in_RDI + 0x30) << 1;
    }
    uVar3 = (ulong)local_6c;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar3;
    uVar4 = SUB168(auVar2 * ZEXT816(0x10),0);
    uVar6 = uVar4 + 8;
    if (SUB168(auVar2 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar4) {
      uVar6 = 0xffffffffffffffff;
    }
    puVar5 = (ulong *)operator_new__(uVar6,(nothrow_t *)&std::nothrow);
    local_78 = (Edition *)0x0;
    if (puVar5 != (ulong *)0x0) {
      *puVar5 = uVar3;
      local_78 = (Edition *)(puVar5 + 1);
      if (uVar3 != 0) {
        local_a0 = local_78;
        do {
          Edition::Edition(local_a0);
          local_a0 = local_a0 + 1;
        } while (local_a0 != local_78 + uVar3);
      }
    }
    if (local_78 == (Edition *)0x0) {
      local_1 = false;
    }
    else {
      for (local_60 = 0; local_60 < *(int *)(in_RDI + 0x34); local_60 = local_60 + 1) {
        Edition::ShallowCopy
                  ((Edition *)(*(long *)(in_RDI + 0x28) + (long)local_60 * 0x10),local_78 + local_60
                  );
      }
      pEVar1 = *(Edition **)(in_RDI + 0x28);
      if (pEVar1 != (Edition *)0x0) {
        this_00 = pEVar1 + *(long *)&pEVar1[-1].m_atoms_size;
        while (pEVar1 != this_00) {
          this_00 = this_00 + -1;
          Edition::~Edition(this_00);
        }
        operator_delete__(&pEVar1[-1].m_atoms_size);
      }
      *(Edition **)(in_RDI + 0x28) = local_78;
      *(int *)(in_RDI + 0x30) = local_6c;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool Chapters::ExpandEditionsArray() {
  if (m_editions_size > m_editions_count)
    return true;  // nothing else to do

  const int size = (m_editions_size == 0) ? 1 : 2 * m_editions_size;

  Edition* const editions = new (std::nothrow) Edition[size];

  if (editions == NULL)
    return false;

  for (int idx = 0; idx < m_editions_count; ++idx) {
    m_editions[idx].ShallowCopy(editions[idx]);
  }

  delete[] m_editions;
  m_editions = editions;

  m_editions_size = size;
  return true;
}